

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.h
# Opt level: O2

void __thiscall crnlib::symbol_codec::~symbol_codec(symbol_codec *this)

{
  vector<crnlib::symbol_codec::output_symbol>::~vector(&this->m_output_syms);
  vector<unsigned_char>::~vector(&this->m_arith_output_buf);
  vector<unsigned_char>::~vector(&this->m_output_buf);
  return;
}

Assistant:

class CRN_EXPORT symbol_codec
    {
    public:
        symbol_codec();

        void clear();

        // Encoding
        void start_encoding(uint expected_file_size);
        uint encode_transmit_static_huffman_data_model(static_huffman_data_model& model, bool simulate, static_huffman_data_model* pDelta_model = nullptr);
        void encode_bits(uint bits, uint num_bits);
        void encode_align_to_byte();
        void encode(uint sym, adaptive_huffman_data_model& model);
        void encode(uint sym, static_huffman_data_model& model);
        void encode_truncated_binary(uint v, uint n);
        static uint encode_truncated_binary_cost(uint v, uint n);
        void encode_golomb(uint v, uint m);
        void encode_rice(uint v, uint m);
        static uint encode_rice_get_cost(uint v, uint m);
        void encode(uint bit, adaptive_bit_model& model, bool update_model = true);
        void encode(uint sym, adaptive_arith_data_model& model);

        inline void encode_enable_simulation(bool enabled)
        {
            m_simulate_encoding = enabled;
        }
        inline bool encode_get_simulation()
        {
            return m_simulate_encoding;
        }
        inline uint encode_get_total_bits_written() const
        {
            return m_total_bits_written;
        }

        void stop_encoding(bool support_arith);

        const crnlib::vector<uint8>& get_encoding_buf() const
        {
            return m_output_buf;
        }
        crnlib::vector<uint8>& get_encoding_buf()
        {
            return m_output_buf;
        }

        // Decoding

        typedef void (*need_bytes_func_ptr)(size_t num_bytes_consumed, void* pPrivate_data, const uint8*& pBuf, size_t& buf_size, bool& eof_flag);

        bool start_decoding(const uint8* pBuf, size_t buf_size, bool eof_flag = true, need_bytes_func_ptr pNeed_bytes_func = nullptr, void* pPrivate_data = nullptr);
        void decode_set_input_buffer(const uint8* pBuf, size_t buf_size, const uint8* pBuf_next, bool eof_flag = true);
        inline uint64 decode_get_bytes_consumed() const
        {
            return m_pDecode_buf_next - m_pDecode_buf;
        }
        inline uint64 decode_get_bits_remaining() const
        {
            return ((m_pDecode_buf_end - m_pDecode_buf_next) << 3) + m_bit_count;
        }
        void start_arith_decoding();
        bool decode_receive_static_huffman_data_model(static_huffman_data_model& model, static_huffman_data_model* pDeltaModel);
        uint decode_bits(uint num_bits);
        uint decode_peek_bits(uint num_bits);
        void decode_remove_bits(uint num_bits);
        void decode_align_to_byte();
        int decode_remove_byte_from_bit_buf();
        uint decode(adaptive_huffman_data_model& model);
        uint decode(static_huffman_data_model& model);
        uint decode_truncated_binary(uint n);
        uint decode_golomb(uint m);
        uint decode_rice(uint m);
        uint decode(adaptive_bit_model& model, bool update_model = true);
        uint decode(adaptive_arith_data_model& model);
        uint64 stop_decoding();

        uint get_total_model_updates() const
        {
            return m_total_model_updates;
        }

    public:
        const uint8* m_pDecode_buf;
        const uint8* m_pDecode_buf_next;
        const uint8* m_pDecode_buf_end;
        size_t m_decode_buf_size;
        bool m_decode_buf_eof;

        need_bytes_func_ptr m_pDecode_need_bytes_func;
        void* m_pDecode_private_data;

#if CRNLIB_SYMBOL_CODEC_USE_64_BIT_BUFFER
        typedef uint64 bit_buf_t;
        enum
        {
            cBitBufSize = 64
        };
#else
        typedef uint32 bit_buf_t;
        enum
        {
            cBitBufSize = 32
        };
#endif

        bit_buf_t m_bit_buf;
        int m_bit_count;

        uint m_total_model_updates;

        crnlib::vector<uint8> m_output_buf;
        crnlib::vector<uint8> m_arith_output_buf;

        struct output_symbol
        {
            uint m_bits;

            enum
            {
                cArithSym = -1,
                cAlignToByteSym = -2
            };
            int16 m_num_bits;

            uint16 m_arith_prob0;
        };
        crnlib::vector<output_symbol> m_output_syms;

        uint m_total_bits_written;
        bool m_simulate_encoding;

        uint m_arith_base;
        uint m_arith_value;
        uint m_arith_length;
        uint m_arith_total_bits;

        bool m_support_arith;

        void put_bits_init(uint expected_size);
        void record_put_bits(uint bits, uint num_bits);

        void arith_propagate_carry();
        void arith_renorm_enc_interval();
        void arith_start_encoding();
        void arith_stop_encoding();

        void put_bits(uint bits, uint num_bits);
        void put_bits_align_to_byte();
        void flush_bits();
        void assemble_output_buf(bool support_arith);

        void get_bits_init();
        uint get_bits(uint num_bits);
        void remove_bits(uint num_bits);

        void decode_need_bytes();

        enum
        {
            cNull,
            cEncoding,
            cDecoding
        } m_mode;
    }